

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_pack_origin(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  nghttp2_buf_chain *pnVar1;
  ulong *puVar2;
  ulong uVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  ulong uVar7;
  
  pnVar1 = bufs->head;
  iVar4 = -0x20a;
  if ((frame->hd).length <= (ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last)) {
    puVar2 = (ulong *)frame->payload;
    puVar5 = (pnVar1->buf).pos + -9;
    (pnVar1->buf).pos = puVar5;
    nghttp2_frame_pack_frame_hd(puVar5,&frame->hd);
    puVar5 = (pnVar1->buf).last;
    if (*puVar2 != 0) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        uVar3 = puVar2[1];
        nghttp2_put_uint16be(puVar5,*(uint16_t *)(uVar3 + lVar6));
        puVar5 = (pnVar1->buf).last + 2;
        (pnVar1->buf).last = puVar5;
        puVar5 = nghttp2_cpymem(puVar5,*(void **)((uVar3 - 8) + lVar6),*(size_t *)(uVar3 + lVar6));
        (pnVar1->buf).last = puVar5;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < *puVar2);
    }
    iVar4 = 0;
    if ((long)puVar5 - (long)(pnVar1->buf).pos != (frame->hd).length + 9) {
      __assert_fail("nghttp2_buf_len(buf) == NGHTTP2_FRAME_HDLEN + frame->hd.length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                    ,0x33b,"int nghttp2_frame_pack_origin(nghttp2_bufs *, nghttp2_extension *)");
    }
  }
  return iVar4;
}

Assistant:

int nghttp2_frame_pack_origin(nghttp2_bufs *bufs, nghttp2_extension *frame) {
  nghttp2_buf *buf;
  nghttp2_ext_origin *origin;
  nghttp2_origin_entry *orig;
  size_t i;

  origin = frame->payload;

  buf = &bufs->head->buf;

  if (nghttp2_buf_avail(buf) < frame->hd.length) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  for (i = 0; i < origin->nov; ++i) {
    orig = &origin->ov[i];
    nghttp2_put_uint16be(buf->last, (uint16_t)orig->origin_len);
    buf->last += 2;
    buf->last = nghttp2_cpymem(buf->last, orig->origin, orig->origin_len);
  }

  assert(nghttp2_buf_len(buf) == NGHTTP2_FRAME_HDLEN + frame->hd.length);

  return 0;
}